

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<TraceEnum>::detachAndGrow
          (QArrayDataPointer<TraceEnum> *this,GrowthPosition where,qsizetype n,TraceEnum **data,
          QArrayDataPointer<TraceEnum> *old)

{
  bool bVar1;
  long lVar2;
  
  if ((this->d == (Data *)0x0) ||
     (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
  goto LAB_00110b9c;
  if (n == 0) {
    return;
  }
  if (where == GrowsAtEnd) {
    lVar2 = freeSpaceAtEnd(this);
LAB_00110bd7:
    if (n <= lVar2) {
      return;
    }
  }
  else if (where == GrowsAtBeginning) {
    lVar2 = freeSpaceAtBegin(this);
    goto LAB_00110bd7;
  }
  bVar1 = tryReadjustFreeSpace(this,where,n,data);
  if (bVar1) {
    return;
  }
LAB_00110b9c:
  reallocateAndGrow(this,where,n,old);
  return;
}

Assistant:

void detachAndGrow(QArrayData::GrowthPosition where, qsizetype n, const T **data,
                       QArrayDataPointer *old)
    {
        const bool detach = needsDetach();
        bool readjusted = false;
        if (!detach) {
            if (!n || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n))
                return;
            readjusted = tryReadjustFreeSpace(where, n, data);
            Q_ASSERT(!readjusted
                     || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                     || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n));
        }

        if (!readjusted)
            reallocateAndGrow(where, n, old);
    }